

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O1

int Quantize(void *hPtr,char *output,TrainingArgs trainArgs,char *label)

{
  __node_base_ptr *pp_Var1;
  TrainingArgs args_00;
  AutotuneArgs autotuneArgs;
  bool bVar2;
  size_t sVar3;
  long *plVar4;
  __node_base_ptr *pp_Var5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  TrainingArgs *pTVar9;
  double *pdVar10;
  byte bVar11;
  string outPath;
  Args args;
  undefined1 in_stack_fffffffffffffd28 [96];
  _Any_data local_238;
  __node_base_ptr local_228;
  undefined8 uStack_220;
  string local_210;
  char *local_1f0;
  char *pcStack_1e8;
  undefined8 local_1e0;
  char *pcStack_1d8;
  int local_1d0;
  undefined1 local_1c8 [164];
  model_name local_124;
  
  bVar11 = 0;
  if (((*hPtr == 0) || (*(long *)((long)hPtr + 0x10) == 0)) || (*(long *)((long)hPtr + 0x40) == 0))
  {
    pcVar6 = "Model is not ready!";
LAB_00144221:
    std::__cxx11::string::_M_replace
              (0x158518,0,(char *)_lastError_abi_cxx11_._M_string_length,(ulong)pcVar6);
    return -1;
  }
  fasttext::FastText::getArgs((Args *)local_1c8,(FastText *)hPtr);
  fasttext::Args::~Args((Args *)local_1c8);
  if (local_124 != sup) {
    pcVar6 = "Only supervised models can be quantized!";
    goto LAB_00144221;
  }
  if (output == (char *)0x0) {
    pcVar6 = "Output is not specified!";
    goto LAB_00144221;
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  sVar3 = strlen(output);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,output,output + sVar3);
  if (local_210._M_string_length == 0) {
    iVar8 = -1;
    std::__cxx11::string::_M_replace
              (0x158518,0,(char *)_lastError_abi_cxx11_._M_string_length,0x1497a1);
    goto LAB_001444ac;
  }
  pp_Var1 = (__node_base_ptr *)(local_1c8 + 0x10);
  local_1c8._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,".bin","");
  bVar2 = EndsWith(&local_210,(string *)local_1c8,true);
  if ((__node_base_ptr *)local_1c8._0_8_ != pp_Var1) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  if (bVar2) {
    std::__cxx11::string::substr((ulong)&local_238,(ulong)&local_210);
    plVar4 = (long *)std::__cxx11::string::append(local_238._M_pod_data);
    pp_Var5 = (__node_base_ptr *)(plVar4 + 2);
    if ((__node_base_ptr *)*plVar4 == pp_Var5) {
      local_1c8._16_8_ = *pp_Var5;
      local_1c8._24_8_ = plVar4[3];
      local_1c8._0_8_ = pp_Var1;
    }
    else {
      local_1c8._16_8_ = *pp_Var5;
      local_1c8._0_8_ = (__node_base_ptr *)*plVar4;
    }
    local_1c8._8_8_ = plVar4[1];
    *plVar4 = (long)pp_Var5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_210,(string *)local_1c8);
    if ((__node_base_ptr *)local_1c8._0_8_ != pp_Var1) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    if ((__node_base_ptr *)local_238._M_unused._0_8_ != &local_228) {
LAB_001443b5:
      operator_delete(local_238._M_unused._M_object,(ulong)((long)&local_228->_M_nxt + 1));
    }
  }
  else {
    local_1c8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,".ftz","");
    bVar2 = EndsWith(&local_210,(string *)local_1c8,true);
    if ((__node_base_ptr *)local_1c8._0_8_ != pp_Var1) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    if (!bVar2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     &local_210,".ftz");
      std::__cxx11::string::operator=((string *)&local_210,(string *)local_1c8);
      local_228 = (__node_base_ptr)local_1c8._16_8_;
      local_238._M_unused._0_8_ = local_1c8._0_8_;
      if ((__node_base_ptr *)local_1c8._0_8_ != pp_Var1) goto LAB_001443b5;
    }
  }
  local_1f0 = "";
  pcStack_1e8 = "f1";
  local_1e0 = 0x12c00000001;
  pcStack_1d8 = "";
  pTVar9 = &trainArgs;
  pdVar10 = (double *)&stack0xfffffffffffffd28;
  for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pdVar10 = pTVar9->lr;
    pTVar9 = (TrainingArgs *)((long)pTVar9 + (ulong)bVar11 * -0x10 + 8);
    pdVar10 = pdVar10 + (ulong)bVar11 * -2 + 1;
  }
  args_00.dsub._4_4_ = trainArgs.dsub._4_4_;
  args_00._0_96_ = in_stack_fffffffffffffd28;
  autotuneArgs.metric = pcStack_1e8;
  autotuneArgs.validationFile = local_1f0;
  autotuneArgs.predictions = (undefined4)local_1e0;
  autotuneArgs.duration = local_1e0._4_4_;
  autotuneArgs.modelSize = pcStack_1d8;
  autotuneArgs.verbose = local_1d0;
  CreateArgs((Args *)local_1c8,args_00,autotuneArgs,label,(char *)0x0);
  local_228 = (__node_base_ptr)0x0;
  uStack_220 = 0;
  local_238._M_unused._M_object = (__node_base_ptr *)0x0;
  local_238._8_8_ = 0;
  fasttext::FastText::quantize((FastText *)hPtr,(Args *)local_1c8,(TrainCallback *)&local_238);
  if (local_228 != (__node_base_ptr)0x0) {
    (*(code *)local_228)(&local_238,&local_238,3);
  }
  iVar8 = 0;
  fasttext::FastText::saveModel((FastText *)hPtr,&local_210);
  fasttext::Args::~Args((Args *)local_1c8);
LAB_001444ac:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p == &local_210.field_2) {
    return iVar8;
  }
  operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  return iVar8;
}

Assistant:

Quantize(void* hPtr, const char* output, TrainingArgs trainArgs, const char* label)
{
    if (!IsModelReady(hPtr))
    {
        _lastError = "Model is not ready!";
        return -1;
    }

    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    if (fastText->getArgs().model != model_name::sup)
    {
        _lastError = "Only supervised models can be quantized!";
        return -1;
    }

    if (output == nullptr)
    {
        _lastError = "Output is not specified!";
        return -1;
    }

    auto outPath = std::string(output);
    if (outPath.empty())
    {
        _lastError = "Output is not specified!";
        return -1;
    }

    if (EndsWith(outPath, ".bin", true))
        outPath = outPath.substr(0, outPath.length() - 4) + ".ftz";
    else if (!EndsWith(outPath, ".ftz", true))
        outPath = outPath + ".ftz";

    auto args = CreateArgs(trainArgs, AutotuneArgs(), label, nullptr);

    try {
        fastText->quantize(args);
        fastText->saveModel(outPath);

        return 0;
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }
}